

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_peread.c
# Opt level: O2

int pe_get_section_info(void *obj,Dwarf_Unsigned section_index,
                       Dwarf_Obj_Access_Section_a *return_section,int *error)

{
  long lVar1;
  long lVar2;
  
  if (section_index < *(ulong *)((long)obj + 0x2b0)) {
    lVar1 = *(long *)((long)obj + 0x2b8);
    lVar2 = section_index * 0x70;
    return_section->as_name = *(char **)(lVar1 + 8 + lVar2);
    return_section->as_type = 0;
    return_section->as_flags = *(Dwarf_Unsigned *)(lVar1 + 0x58 + lVar2);
    return_section->as_addr = *(long *)(lVar1 + 0x20 + lVar2) + *(long *)((long)obj + 0x100);
    return_section->as_offset = *(Dwarf_Unsigned *)(lVar1 + 0x30 + lVar2);
    return_section->as_size = *(Dwarf_Unsigned *)(lVar1 + 0x18 + lVar2);
    return_section->as_link = 0;
    return_section->as_info = 0;
    return_section->as_addralign = 0;
    return_section->as_entrysize = 0;
    return 0;
  }
  return -1;
}

Assistant:

static int
pe_get_section_info (void *obj,
    Dwarf_Unsigned section_index,
    Dwarf_Obj_Access_Section_a *return_section,
    int *error)
{
    dwarf_pe_object_access_internals_t *pep =
        (dwarf_pe_object_access_internals_t*)(obj);

    (void)error;
    if (section_index < pep->pe_section_count) {
        struct dwarf_pe_generic_image_section_header *sp = 0;
        sp = pep->pe_sectionptr + section_index;
        return_section->as_name = sp->dwarfsectname;
        return_section->as_type = 0;
        return_section->as_flags = sp->Characteristics;
        return_section->as_addr = pep->pe_OptionalHeader.ImageBase +
            sp->VirtualAddress;
        return_section->as_offset = sp->PointerToRawData;
        /*  SizeOfRawData can be rounded or truncated,
            use VirtualSize for the real analog of Elf
            section size. */
        return_section->as_size = sp->VirtualSize;
        return_section->as_link = 0;
        return_section->as_info = 0;
        return_section->as_addralign = 0;
        return_section->as_entrysize = 0;
        return DW_DLV_OK;
    }
    return DW_DLV_NO_ENTRY;
}